

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::LevelTest_TestTargetLevel19_Test::~LevelTest_TestTargetLevel19_Test
          (LevelTest_TestTargetLevel19_Test *this)

{
  anon_unknown.dwarf_128b966::LevelTest::~LevelTest((LevelTest *)(this + -0x18));
  return;
}

Assistant:

TEST_P(LevelTest, TestTargetLevel19) {
  std::unique_ptr<libaom_test::VideoSource> video;
  video.reset(new libaom_test::Y4mVideoSource("park_joy_90p_8_420.y4m", 0, 10));
  ASSERT_NE(video, nullptr);
  // Level index 19 corresponding to level 6.3.
  target_level_ = 19;
  ASSERT_NO_FATAL_FAILURE(RunLoop(video.get()));
}